

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

int __thiscall luna::CodeGenerateVisitor::PrepareUpvalue(CodeGenerateVisitor *this,String *name)

{
  value_type pGVar1;
  bool bVar2;
  int iVar3;
  Function *this_00;
  reference ppGVar4;
  char *module;
  char *pcVar5;
  undefined8 uVar6;
  String *pSVar7;
  CodeGenerateVisitor *in_RDI;
  int index_2;
  LocalNameInfo *name_info;
  int index_1;
  value_type current;
  bool parent_local;
  int register_index;
  stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
  parents;
  int index;
  Function *function;
  value_type *in_stack_fffffffffffffee8;
  String *in_stack_fffffffffffffef0;
  Function *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  String *in_stack_ffffffffffffff08;
  Function *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CodeGenerateException *in_stack_ffffffffffffff20;
  int local_88;
  int local_4;
  
  this_00 = GetCurrentFunction(in_RDI);
  local_4 = Function::SearchUpvalue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (local_4 < 0) {
    std::
    stack<luna::GenerateFunction*,std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>>
    ::stack<std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>,void>
              ((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                *)in_stack_fffffffffffffef0);
    std::
    stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
    ::push((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
            *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_88 = -1;
    while (bVar2 = std::
                   stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                   ::empty((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                            *)0x21bd21), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppGVar4 = std::
                stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                ::top((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                       *)0x21bd43);
      pGVar1 = *ppGVar4;
      if (pGVar1 == (value_type)0x0) {
        __assert_fail("current",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x157,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
      }
      if (local_88 < 0) {
        in_stack_ffffffffffffff08 =
             (String *)
             SearchFunctionLocalName
                       ((CodeGenerateVisitor *)in_stack_ffffffffffffff08,
                        (GenerateFunction *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        (String *)in_stack_fffffffffffffef8);
        if (in_stack_ffffffffffffff08 == (String *)0x0) {
          iVar3 = Function::SearchUpvalue(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          if (iVar3 < 0) {
            std::
            stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
            ::push((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                    *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
            in_stack_ffffffffffffff04 = iVar3;
          }
          else {
            in_stack_ffffffffffffff04 = iVar3;
            std::
            stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
            ::pop((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                   *)0x21bf66);
            local_88 = iVar3;
          }
        }
        else {
          local_88 = *(int *)&(in_stack_ffffffffffffff08->super_GCObject)._vptr_GCObject;
          std::
          stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
          ::pop((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
                 *)0x21bf14);
        }
      }
      else {
        local_88 = Function::AddUpvalue
                             (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),
                              in_stack_ffffffffffffff00);
        if (0xf9 < local_88) {
          module = (char *)__cxa_allocate_exception(0x20);
          pSVar7 = Function::GetModule(pGVar1->function_);
          pcVar5 = String::GetCStr(pSVar7);
          iVar3 = (int)((ulong)pcVar5 >> 0x20);
          Function::GetLine(pGVar1->function_);
          CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                    ((CodeGenerateException *)pSVar7,module,iVar3,
                     (char (*) [30])in_stack_ffffffffffffff08);
          __cxa_throw(module,&CodeGenerateException::typeinfo,
                      CodeGenerateException::~CodeGenerateException);
        }
        std::
        stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
        ::pop((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
               *)0x21beb7);
      }
    }
    if (local_88 < 0) {
      __assert_fail("register_index >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x184,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
    }
    local_4 = Function::AddUpvalue
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),in_stack_ffffffffffffff00)
    ;
    iVar3 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if (0xf9 < local_4) {
      uVar6 = __cxa_allocate_exception(0x20);
      pSVar7 = Function::GetModule(this_00);
      String::GetCStr(pSVar7);
      Function::GetLine(this_00);
      CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,iVar3,
                 (char (*) [30])in_stack_ffffffffffffff08);
      __cxa_throw(uVar6,&CodeGenerateException::typeinfo,
                  CodeGenerateException::~CodeGenerateException);
    }
    std::
    stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
    ::~stack((stack<luna::GenerateFunction_*,_std::deque<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>_>
              *)0x21c0ae);
  }
  return local_4;
}

Assistant:

int PrepareUpvalue(String *name) const
        {
            // If the upvalue info existed, then return the index of the upvalue
            auto function = GetCurrentFunction();
            auto index = function->SearchUpvalue(name);
            if (index >= 0)
                return index;

            // Search start from parent
            std::stack<GenerateFunction *> parents;
            parents.push(current_function_->parent_);

            int register_index = -1;
            bool parent_local = false;
            while (!parents.empty())
            {
                auto current = parents.top();
                assert(current);
                if (register_index >= 0)
                {
                    // Find it, add it as upvalue to function,
                    // and continue backtrack
                    auto index = current->function_->AddUpvalue(name, parent_local,
                                                                register_index);
                    CHECK_UPVALUE_MAX_COUNT(index, current->function_);
                    register_index = index;
                    parent_local = false;
                    parents.pop();
                }
                else
                {
                    // Find name from local names
                    auto name_info = SearchFunctionLocalName(current, name);
                    if (name_info)
                    {
                        // Find it, get its register_id and start backtrack
                        register_index = name_info->register_id_;
                        parent_local = true;
                        parents.pop();
                    }
                    else
                    {
                        // Find it from current function upvalue list
                        auto index = current->function_->SearchUpvalue(name);
                        if (index >= 0)
                        {
                            // Find it, the name upvalue has been inserted,
                            // then get the upvalue index, and start backtrack
                            register_index = index;
                            parent_local = false;
                            parents.pop();
                        }
                        else
                        {
                            // Not find it, continue to search its parent
                            parents.push(current->parent_);
                        }
                    }
                }
            }

            // Add it as upvalue to current function
            assert(register_index >= 0);
            index = function->AddUpvalue(name, parent_local, register_index);
            CHECK_UPVALUE_MAX_COUNT(index, function);
            return index;
        }